

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring_agg.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::BindBitstringAgg
          (duckdb *this,ClientContext *context,AggregateFunction *function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  int iVar1;
  reference pvVar2;
  pointer pEVar3;
  type pEVar4;
  undefined8 *puVar5;
  BitstringAggBindData *this_00;
  BinderException *this_01;
  Value max;
  Value min;
  Value local_128;
  Value local_e8;
  Value local_a8;
  Value local_68;
  
  if ((long)(arguments->
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(arguments->
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x18) {
    this_00 = (BitstringAggBindData *)operator_new(0x88);
    BitstringAggBindData::BitstringAggBindData(this_00);
    *(BitstringAggBindData **)this = this_00;
    return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
           (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
  }
  pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,1);
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar2);
  iVar1 = (*(pEVar3->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar3);
  if ((char)iVar1 != '\0') {
    pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,2);
    pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar2);
    iVar1 = (*(pEVar3->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar3);
    if ((char)iVar1 != '\0') {
      pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,1);
      pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(pvVar2);
      ExpressionExecutor::EvaluateScalar(&local_a8,context,pEVar4,false);
      pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,2);
      pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(pvVar2);
      ExpressionExecutor::EvaluateScalar(&local_e8,context,pEVar4,false);
      Function::EraseArgument((SimpleFunction *)function,arguments,2);
      Function::EraseArgument((SimpleFunction *)function,arguments,1);
      puVar5 = (undefined8 *)operator_new(0x88);
      Value::Value(&local_128,&local_a8);
      Value::Value(&local_68,&local_e8);
      *puVar5 = &PTR__BitstringAggBindData_019d3a30;
      Value::Value((Value *)(puVar5 + 1),&local_128);
      Value::Value((Value *)(puVar5 + 9),&local_68);
      Value::~Value(&local_68);
      Value::~Value(&local_128);
      *(undefined8 **)this = puVar5;
      Value::~Value(&local_e8);
      Value::~Value(&local_a8);
      return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
             (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
    }
  }
  this_01 = (BinderException *)__cxa_allocate_exception(0x10);
  local_128.type_._0_8_ = (long)&local_128 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_128,"bitstring_agg requires a constant min and max argument","");
  BinderException::BinderException(this_01,(string *)&local_128);
  __cxa_throw(this_01,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<FunctionData> BindBitstringAgg(ClientContext &context, AggregateFunction &function,
                                          vector<unique_ptr<Expression>> &arguments) {
	if (arguments.size() == 3) {
		if (!arguments[1]->IsFoldable() || !arguments[2]->IsFoldable()) {
			throw BinderException("bitstring_agg requires a constant min and max argument");
		}
		auto min = ExpressionExecutor::EvaluateScalar(context, *arguments[1]);
		auto max = ExpressionExecutor::EvaluateScalar(context, *arguments[2]);
		Function::EraseArgument(function, arguments, 2);
		Function::EraseArgument(function, arguments, 1);
		return make_uniq<BitstringAggBindData>(min, max);
	}
	return make_uniq<BitstringAggBindData>();
}